

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

String * __thiscall
kj::str<kj::_::DebugComparison<kj::String&,char_const(&)[3]>&>
          (String *__return_storage_ptr__,kj *this,
          DebugComparison<kj::String_&,_const_char_(&)[3]> *params)

{
  Array<char> local_28;
  
  _::operator*(&local_28);
  (__return_storage_ptr__->content).ptr = local_28.ptr;
  (__return_storage_ptr__->content).size_ = local_28.size_;
  (__return_storage_ptr__->content).disposer = local_28.disposer;
  local_28.ptr = (char *)0x0;
  local_28.size_ = 0;
  Array<char>::~Array(&local_28);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}